

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void update_topbar_subwindow(game_event_type type,game_event_data *data,void *user)

{
  term *t;
  term_conflict *inv_term;
  term_conflict *old;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  t = Term;
  if ((((player != (player *)0x0) && (player->race != (player_race *)0x0)) &&
      (player->class != (player_class *)0x0)) && (cave != (chunk_conflict *)0x0)) {
    Term_activate((term *)user);
    update_topbar(type,data,user,L'\0');
    update_statusline_aux(L'\x02',L'\0');
    Term_fresh();
    Term_activate(t);
  }
  return;
}

Assistant:

static void update_topbar_subwindow(game_event_type type,
									game_event_data *data, void *user)
{
	term *old = Term;
	term *inv_term = user;

	/* Check sanity */
	if (!(player && player->race && player->class && cave)) return;

	/* Activate */
	Term_activate(inv_term);

	update_topbar(type, data, user, 0);

	update_statusline_aux(2, 0);

	Term_fresh();
	
	/* Restore */
	Term_activate(old);
}